

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallAndroidMKGenerator.cxx
# Opt level: O3

void __thiscall
cmExportInstallAndroidMKGenerator::GenerateInterfaceProperties
          (cmExportInstallAndroidMKGenerator *this,cmGeneratorTarget *target,ostream *os,
          ImportPropertyMap *properties)

{
  string *in_R9;
  string config;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  
  local_38 = 0;
  local_30 = 0;
  local_40 = &local_30;
  if ((this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.Configurations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_cmExportInstallFileGenerator).super_cmExportFileGenerator.Configurations.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_assign((string *)&local_40);
  }
  cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties
            ((cmExportBuildAndroidMKGenerator *)target,(cmGeneratorTarget *)os,(ostream *)properties
             ,(ImportPropertyMap *)0x1,(GenerateType)&local_40,in_R9);
  if (local_40 != &local_30) {
    operator_delete(local_40,CONCAT71(uStack_2f,local_30) + 1);
  }
  return;
}

Assistant:

void cmExportInstallAndroidMKGenerator::GenerateInterfaceProperties(
  cmGeneratorTarget const* target, std::ostream& os,
  const ImportPropertyMap& properties)
{
  std::string config;
  if (!this->Configurations.empty()) {
    config = this->Configurations[0];
  }
  cmExportBuildAndroidMKGenerator::GenerateInterfaceProperties(
    target, os, properties, cmExportBuildAndroidMKGenerator::INSTALL, config);
}